

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IpAddress.cpp
# Opt level: O3

void __thiscall mognetwork::IpAddress::resolve(IpAddress *this)

{
  string *psVar1;
  uint32_t uVar2;
  int iVar3;
  in_addr_t iVar4;
  addrinfo *result;
  addrinfo hints;
  addrinfo *local_60;
  addrinfo local_58;
  
  psVar1 = &this->m_sAddress;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 == 0) {
    this->m_address = 0xffffffff;
  }
  else {
    iVar4 = inet_addr((psVar1->_M_dataplus)._M_p);
    if (iVar4 == 0xffffffff) {
      local_58.ai_socktype = 0;
      local_58.ai_protocol = 0;
      local_58.ai_canonname = (char *)0x0;
      local_58.ai_next = (addrinfo *)0x0;
      local_58.ai_addrlen = 0;
      local_58._20_4_ = 0;
      local_58.ai_addr = (sockaddr *)0x0;
      local_58.ai_flags = 0;
      local_58.ai_family = 2;
      local_60 = (addrinfo *)0x0;
      iVar3 = getaddrinfo((psVar1->_M_dataplus)._M_p,(char *)0x0,&local_58,&local_60);
      if (local_60 != (addrinfo *)0x0 && iVar3 == 0) {
        uVar2 = *(uint32_t *)(local_60->ai_addr->sa_data + 2);
        freeaddrinfo(local_60);
        this->m_address = uVar2;
      }
    }
    else {
      this->m_address = iVar4;
    }
  }
  return;
}

Assistant:

void IpAddress::resolve()
  {
    if (m_sAddress == "255.255.255.255")
      m_address = INADDR_BROADCAST;
    else
      {
	uint32_t ip = inet_addr(m_sAddress.c_str());
	if (ip != INADDR_NONE)
	  m_address = ip;
	else
	  {
	    addrinfo hints;
	    memset(&hints, 0, sizeof(hints));
	    hints.ai_family = AF_INET;
	    addrinfo* result = NULL;
	    if (getaddrinfo(m_sAddress.c_str(), NULL, &hints, &result) == 0)
	      {
		if (result)
		  {
		    ip = reinterpret_cast<sockaddr_in*>(result->ai_addr)->sin_addr.s_addr;
		    freeaddrinfo(result);
		    m_address = ip;
		  }
	      }
	  }
      }
  }